

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O2

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::LineNumberOps,_void>::enumeration
               (IO *io,LineNumberOps *value)

{
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_extended_op",DW_LNS_extended_op);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_copy",DW_LNS_copy);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_advance_pc",DW_LNS_advance_pc);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_advance_line",DW_LNS_advance_line);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_set_file",DW_LNS_set_file);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_set_column",DW_LNS_set_column);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_negate_stmt",DW_LNS_negate_stmt);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_set_basic_block",DW_LNS_set_basic_block)
  ;
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_const_add_pc",DW_LNS_const_add_pc);
  IO::enumCase<llvm::dwarf::LineNumberOps>
            (io,value,"DW_LNS_fixed_advance_pc",DW_LNS_fixed_advance_pc);
  IO::enumCase<llvm::dwarf::LineNumberOps>
            (io,value,"DW_LNS_set_prologue_end",DW_LNS_set_prologue_end);
  IO::enumCase<llvm::dwarf::LineNumberOps>
            (io,value,"DW_LNS_set_epilogue_begin",DW_LNS_set_epilogue_begin);
  IO::enumCase<llvm::dwarf::LineNumberOps>(io,value,"DW_LNS_set_isa",DW_LNS_set_isa);
  IO::enumFallback<llvm::yaml::Hex8,llvm::dwarf::LineNumberOps>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::LineNumberOps &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex8>(value);
  }